

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O0

void __thiscall
OpenMD::
AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>::
~AndParamConstraint(AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>
                    *this)

{
  LessThanOrEqualToConstraint<int>::~LessThanOrEqualToConstraint
            ((LessThanOrEqualToConstraint<int> *)0x2cf92c);
  GreaterThanOrEqualTo<int>::~GreaterThanOrEqualTo((GreaterThanOrEqualTo<int> *)0x2cf93a);
  ParamConstraintFacade<OpenMD::AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>_>
  ::~ParamConstraintFacade
            ((ParamConstraintFacade<OpenMD::AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>_>
              *)0x2cf944);
  return;
}

Assistant:

AndParamConstraint(Cons1T cons1, Cons2T cons2) :
        cons1_(cons1), cons2_(cons2) {
      std::stringstream iss;
      iss << "(" << cons1_.getConstraintDescription() << " and "
          << cons2_.getConstraintDescription() << ")";
      this->description_ = iss.str();
    }